

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall
GlobOpt::CaptureValuesIncremental
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  uint uVar1;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2
  ;
  Type TVar3;
  JitArenaAllocator *pJVar4;
  Sym *this_00;
  ValueInfo *this_01;
  long lVar5;
  code *pcVar6;
  BOOLEAN BVar7;
  bool bVar8;
  undefined4 *puVar9;
  Type *pTVar10;
  StackSym *pSVar11;
  StackSym *pSVar12;
  Type *pTVar13;
  StackSym *pSVar14;
  Value *pVVar15;
  HashBucket *pHVar16;
  VarConstantValueInfo *pVVar17;
  uint key;
  bool bVar18;
  bool bVar19;
  BailoutConstantValue param2;
  BailoutConstantValue param2_00;
  BailoutConstantValue param2_01;
  BVUnitT<unsigned_long> local_a0;
  SparseBVUnit _unit;
  undefined1 local_90 [8];
  BailoutConstantValue constValue;
  int32 intConstValue;
  undefined1 local_58 [8];
  Iterator iterConst;
  Iterator iterCopyPropSym;
  
  local_58 = (undefined1  [8])(block->globOptData).capturedValues;
  iterConst.current =
       &(((CapturedValues *)local_58)->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
  if (local_58 == (undefined1  [8])0x0) {
    bVar18 = false;
    bVar19 = false;
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    iterConst.current = (NodeBase *)0x0;
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
  }
  else {
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)(((CapturedValues *)local_58)->constantValues).
            super_SListNodeBase<Memory::ArenaAllocator>.next;
    bVar18 = (undefined1  [8])iterConst.list != local_58;
    if (!bVar18) {
      iterConst.list = &((CapturedValues *)0x0)->constantValues;
    }
    pSVar2 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)(((CapturedValues *)local_58)->copyPropSyms).
                super_SListNodeBase<Memory::ArenaAllocator>.next;
    bVar19 = pSVar2 != (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)iterConst.current;
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)(CapturedValues *)0x0;
    if (bVar19) {
      iterCopyPropSym.list = pSVar2;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).changedSyms,0xffffffff);
  if (argsToCapture != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((block->globOptData).changedSyms,argsToCapture);
  }
  _unit.word = (Type)(block->globOptData).changedSyms;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while (TVar3 = *_unit.word, TVar3 != 0) {
    constValue.u.intConst.value._4_4_ = *(undefined4 *)(TVar3 + 8);
    local_a0.word = *(ulong *)(TVar3 + 0x10);
    _unit.word = TVar3;
LAB_0045bfb9:
    if (local_a0.word != 0) {
      lVar5 = 0;
      if (local_a0.word != 0) {
        for (; (local_a0.word >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear(&local_a0,(BVIndex)lVar5);
      if (bVar18) {
        pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)local_58);
        pSVar12 = pTVar10->key;
      }
      else {
        pSVar12 = (StackSym *)0x0;
      }
      key = (BVIndex)lVar5 + constValue.u.intConst.value._4_4_;
      while (pSVar12 != (StackSym *)0x0) {
        uVar1 = (pSVar12->super_Sym).m_id;
        if (key <= uVar1) {
          if (uVar1 == key) {
            if (iterConst.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar18 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar18) goto LAB_0045c7f2;
              *puVar9 = 0;
            }
            iterConst.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar18 = (undefined1  [8])iterConst.list != local_58;
            if (!bVar18) {
              iterConst.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
          }
          break;
        }
        if ((pSVar12->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar18 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                              ,0x73,"(constSym->IsStackSym())","constSym->IsStackSym()");
          if (!bVar18) goto LAB_0045c7f2;
          *puVar9 = 0;
        }
        pSVar11 = Sym::AsStackSym(&pSVar12->super_Sym);
        if ((pSVar11->field_0x1a & 0x30) == 0) {
          pJVar4 = this->func->m_alloc;
          pSVar12 = Sym::AsStackSym(&pSVar12->super_Sym);
          pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)local_58);
          param2._4_4_ = 0;
          param2.type = (pTVar10->value).type;
          param2._1_3_ = *(undefined3 *)&(pTVar10->value).field_0x1;
          param2.u = (pTVar10->value).u;
          SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
          ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                    ((EditingIterator *)bailOutConstValuesIter,&pJVar4->super_ArenaAllocator,pSVar12
                     ,param2);
        }
        if (iterConst.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar18 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar18) goto LAB_0045c7f2;
          *puVar9 = 0;
        }
        iterConst.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])iterConst.list == local_58) {
          iterConst.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
          pSVar12 = (StackSym *)0x0;
          bVar18 = false;
        }
        else {
          pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)local_58);
          pSVar12 = pTVar10->key;
          bVar18 = true;
        }
      }
      if (bVar19) {
        pTVar13 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&iterConst.current);
        pSVar12 = pTVar13->key;
      }
      else {
        pSVar12 = (StackSym *)0x0;
      }
      while (pSVar12 != (StackSym *)0x0) {
        uVar1 = (pSVar12->super_Sym).m_id;
        if (key <= uVar1) {
          if (uVar1 == key) {
            if (iterCopyPropSym.list ==
                (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar19 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar19) goto LAB_0045c7f2;
              *puVar9 = 0;
            }
            iterCopyPropSym.list =
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            bVar19 = iterCopyPropSym.list !=
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      *)iterConst.current;
            if (!bVar19) {
              iterCopyPropSym.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
            }
          }
          break;
        }
        pTVar13 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&iterConst.current);
        pSVar11 = pTVar13->value;
        if ((pSVar12->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                              ,0x87,"(capturedSym->IsStackSym())","capturedSym->IsStackSym()");
          if (!bVar19) goto LAB_0045c7f2;
          *puVar9 = 0;
        }
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).changedSyms,(pSVar11->super_Sym).m_id);
        pSVar14 = Sym::AsStackSym(&pSVar12->super_Sym);
        if (BVar7 == '\0') {
          if ((*(uint *)&pSVar14->field_0x18 & 0x300000) == 0) {
            pJVar4 = this->func->m_alloc;
            pSVar12 = Sym::AsStackSym(&pSVar12->super_Sym);
            SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
            EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                      ((EditingIterator *)bailOutCopySymsIter,&pJVar4->super_ArenaAllocator,pSVar12,
                       pSVar11);
          }
        }
        else if (((*(uint *)&pSVar14->field_0x18 & 0x300000) == 0) &&
                (pVVar15 = GlobOptBlockData::FindValue
                                     (&this->currentBlock->globOptData,&pSVar12->super_Sym),
                pVVar15 != (Value *)0x0)) {
          CaptureCopyPropValue(this,block,&pSVar12->super_Sym,pVVar15,bailOutCopySymsIter);
        }
        if (iterCopyPropSym.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar19) goto LAB_0045c7f2;
          *puVar9 = 0;
        }
        iterCopyPropSym.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (iterCopyPropSym.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)iterConst.current) {
          iterCopyPropSym.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
          pSVar12 = (StackSym *)0x0;
          bVar19 = false;
        }
        else {
          pTVar13 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)&iterConst.current);
          pSVar12 = pTVar13->key;
          bVar19 = true;
        }
      }
      if ((key != 0xffffffff) &&
         (pHVar16 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                              ((block->globOptData).symToValueMap,key), pHVar16 != (HashBucket *)0x0
         )) {
        this_00 = pHVar16->value;
        if ((this_00->m_kind != SymKindStack) ||
           ((pSVar12 = Sym::AsStackSym(this_00), (pSVar12->field_0x19 & 0x20) == 0 &&
            (pSVar12 = Sym::AsStackSym(this_00), (pSVar12->field_0x1a & 0x30) == 0)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0xac,
                             "(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()))"
                             ,
                             "symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum())"
                            );
          if (!bVar8) goto LAB_0045c7f2;
          *puVar9 = 0;
        }
        pVVar15 = pHVar16->element;
        if (pVVar15 == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0xaf,"(val)","val");
          if (!bVar8) goto LAB_0045c7f2;
          *puVar9 = 0;
        }
        this_01 = pVVar15->valueInfo;
        if (this_01->symStore != (Sym *)0x0) {
          bVar8 = ValueInfo::TryGetIntConstantValue(this_01,(int32 *)&constValue.u,false);
          if (bVar8) {
            constValue._0_8_ = SEXT48((int)constValue.u.intConst.value._0_4_);
            local_90[0] = 3;
          }
          else {
            bVar8 = ValueInfo::IsVarConstant(this_01);
            if (!bVar8) {
              CaptureCopyPropValue(this,block,this_00,pVVar15,bailOutCopySymsIter);
              goto LAB_0045bfb9;
            }
            pVVar17 = ValueInfo::AsVarConstant(this_01);
            BailoutConstantValue::InitVarConstValue
                      ((BailoutConstantValue *)local_90,pVVar17->varValue);
          }
          pJVar4 = this->func->m_alloc;
          pSVar12 = Sym::AsStackSym(this_00);
          param2_00._4_4_ = 0;
          param2_00._0_4_ = local_90._0_4_;
          param2_00.u = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
          SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
          ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                    ((EditingIterator *)bailOutConstValuesIter,&pJVar4->super_ArenaAllocator,pSVar12
                     ,param2_00);
        }
      }
      goto LAB_0045bfb9;
    }
  }
  while (bVar18) {
    pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)local_58);
    pSVar12 = pTVar10->key;
    if ((pSVar12->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0xd1,"(constSym->IsStackSym())","constSym->IsStackSym()");
      if (!bVar18) goto LAB_0045c7f2;
      *puVar9 = 0;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((block->globOptData).changedSyms,(pSVar12->super_Sym).m_id);
    if (BVar7 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0xd2,"(!block->globOptData.changedSyms->Test(constSym->m_id))",
                          "!block->globOptData.changedSyms->Test(constSym->m_id)");
      if (!bVar18) goto LAB_0045c7f2;
      *puVar9 = 0;
    }
    pSVar11 = Sym::AsStackSym(&pSVar12->super_Sym);
    if ((pSVar11->field_0x1a & 0x30) == 0) {
      pJVar4 = this->func->m_alloc;
      pSVar12 = Sym::AsStackSym(&pSVar12->super_Sym);
      pTVar10 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)local_58);
      param2_01._4_4_ = 0;
      param2_01.type = (pTVar10->value).type;
      param2_01._1_3_ = *(undefined3 *)&(pTVar10->value).field_0x1;
      param2_01.u = (pTVar10->value).u;
      SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
      ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                ((EditingIterator *)bailOutConstValuesIter,&pJVar4->super_ArenaAllocator,pSVar12,
                 param2_01);
    }
    if (iterConst.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar18) goto LAB_0045c7f2;
      *puVar9 = 0;
    }
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    bVar18 = (undefined1  [8])iterConst.list != local_58;
    if (!bVar18) {
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
  }
  do {
    if (!bVar19) {
      return;
    }
    pTVar13 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&iterConst.current);
    pSVar12 = pTVar13->key;
    pTVar13 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Iterator::Data((Iterator *)&iterConst.current);
    pSVar11 = pTVar13->value;
    if ((pSVar12->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0xe1,"(capturedSym->IsStackSym())","capturedSym->IsStackSym()");
      if (!bVar18) {
LAB_0045c7f2:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((block->globOptData).changedSyms,(pSVar12->super_Sym).m_id);
    if ((BVar7 != '\0') ||
       (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).changedSyms,(pSVar11->super_Sym).m_id),
       BVar7 != '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                          ,0xe3,
                          "(!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))"
                          ,
                          "!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id)"
                         );
      if (!bVar18) goto LAB_0045c7f2;
      *puVar9 = 0;
    }
    pSVar14 = Sym::AsStackSym(&pSVar12->super_Sym);
    if ((pSVar14->field_0x1a & 0x30) == 0) {
      pJVar4 = this->func->m_alloc;
      pSVar12 = Sym::AsStackSym(&pSVar12->super_Sym);
      SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
      EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                ((EditingIterator *)bailOutCopySymsIter,&pJVar4->super_ArenaAllocator,pSVar12,
                 pSVar11);
    }
    if (iterCopyPropSym.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar18 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar18) goto LAB_0045c7f2;
      *puVar9 = 0;
    }
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    bVar19 = iterCopyPropSym.list !=
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)iterConst.current;
    if (!bVar19) {
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
    }
  } while( true );
}

Assistant:

void
GlobOpt::CaptureValuesIncremental(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    CapturedValues * currCapturedValues = block->globOptData.capturedValues;
    SListBase<ConstantStackSymValue>::Iterator iterConst(currCapturedValues ? &currCapturedValues->constantValues : nullptr);
    SListBase<CopyPropSyms>::Iterator iterCopyPropSym(currCapturedValues ? &currCapturedValues->copyPropSyms : nullptr);
    bool hasConstValue = currCapturedValues ? iterConst.Next() : false;
    bool hasCopyPropSym = currCapturedValues ? iterCopyPropSym.Next() : false;

    block->globOptData.changedSyms->Set(Js::Constants::InvalidSymID);

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        Value * val = nullptr;

        // First process all unchanged syms with m_id < symId. Then, recapture the current changed sym.

        // copy unchanged const sym to new capturedValues
        Sym * constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        while (constSym && constSym->m_id < symId)
        {
            Assert(constSym->IsStackSym());
            if (!constSym->AsStackSym()->HasArgSlotNum())
            {
                bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
            }

            hasConstValue = iterConst.Next();
            constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        }
        if (constSym && constSym->m_id == symId)
        {
            hasConstValue = iterConst.Next();
        }

        // process unchanged sym; copy-prop sym might have changed
        Sym * capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        while (capturedSym && capturedSym->m_id < symId)
        {
            StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

            Assert(capturedSym->IsStackSym());

            if (!block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
                }
            }
            else
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    val = this->currentBlock->globOptData.FindValue(capturedSym);
                    if (val != nullptr)
                    {
                        CaptureCopyPropValue(block, capturedSym, val, bailOutCopySymsIter);
                    }
                }
            }

            hasCopyPropSym = iterCopyPropSym.Next();
            capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        }
        if (capturedSym && capturedSym->m_id == symId)
        {
            hasCopyPropSym = iterCopyPropSym.Next();
        }

        // recapture changed sym
        HashBucket<Sym *, Value *> * symIdBucket = nullptr;
        if (symId != Js::Constants::InvalidSymID)
        {
            symIdBucket = block->globOptData.symToValueMap->GetBucket(symId);
            if (symIdBucket != nullptr)
            {
                Sym * symIdSym = symIdBucket->value;
                Assert(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()));

                val = symIdBucket->element;
                Assert(val);
                ValueInfo* valueInfo = val->GetValueInfo();

                if (valueInfo->GetSymStore() != nullptr)
                {
                    int32 intConstValue;
                    BailoutConstantValue constValue;

                    if (valueInfo->TryGetIntConstantValue(&intConstValue))
                    {
                        constValue.InitIntConstValue(intConstValue);
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else if (valueInfo->IsVarConstant())
                    {
                        constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else
                    {
                        CaptureCopyPropValue(block, symIdSym, val, bailOutCopySymsIter);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV

    // If, after going over the set of changed syms since the last time we captured values,
    // there are remaining unprocessed entries in the current captured values set,
    // they can simply be copied over to the new bailout info.
    while (hasConstValue)
    {
        Sym * constSym = iterConst.Data().Key();
        Assert(constSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(constSym->m_id));

        if (!constSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
        }

        hasConstValue = iterConst.Next();
    }

    while (hasCopyPropSym)
    {
        Sym * capturedSym = iterCopyPropSym.Data().Key();
        StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

        Assert(capturedSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(capturedSym->m_id) &&
            !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id));

        if (!capturedSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
        }

        hasCopyPropSym = iterCopyPropSym.Next();
    }
}